

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDataServerCommand.cpp
# Opt level: O0

void __thiscall OpenDataServerCommand::~OpenDataServerCommand(OpenDataServerCommand *this)

{
  OpenDataServerCommand *this_local;
  
  ~OpenDataServerCommand(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

OpenDataServerCommand::~OpenDataServerCommand() {
  close(this->client_socket);
}